

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jasper.c
# Opt level: O2

cmdopts_t * cmdopts_parse(int argc,char **argv)

{
  undefined4 uVar1;
  int iVar2;
  cmdopts_t *pcVar3;
  ulonglong uVar4;
  char *pcVar5;
  
  pcVar3 = (cmdopts_t *)malloc(0x2060);
  if (pcVar3 != (cmdopts_t *)0x0) {
    pcVar3->infile = (char *)0x0;
    pcVar3->infmt = -1;
    pcVar3->inopts = (char *)0x0;
    pcVar3->inoptsbuf[0] = '\0';
    pcVar3->outfile = (char *)0x0;
    pcVar3->outfmt = -1;
    pcVar3->outopts = (char *)0x0;
    pcVar3->outoptsbuf[0] = '\0';
    pcVar3->verbose = 0;
    pcVar3->debug = 0;
    pcVar3->version = 0;
    pcVar3->cmptno = -1;
    pcVar3->srgb = 0;
    do {
      uVar1 = jas_getopt(argc,argv,cmdopts_parse::cmdoptions);
      pcVar5 = _jas_optarg;
      switch(uVar1) {
      case 0:
        goto switchD_001027da_caseD_0;
      case 1:
        pcVar3->verbose = 1;
        break;
      case 2:
        pcVar3->infile = _jas_optarg;
        break;
      case 3:
        iVar2 = jas_image_strtofmt(_jas_optarg);
        pcVar3->infmt = iVar2;
        if (iVar2 < 0) {
          fprintf(_stderr,"warning: ignoring invalid input format %s\n",pcVar5);
          pcVar3->infmt = -1;
        }
        break;
      case 4:
        addopt(pcVar3->inoptsbuf,0x1000,_jas_optarg);
        pcVar3->inopts = pcVar3->inoptsbuf;
        break;
      case 5:
        pcVar3->outfile = _jas_optarg;
        break;
      case 6:
        iVar2 = jas_image_strtofmt(_jas_optarg);
        pcVar3->outfmt = iVar2;
        if (iVar2 < 0) goto LAB_001029ed;
        break;
      case 7:
        addopt(pcVar3->outoptsbuf,0x1000,_jas_optarg);
        pcVar3->outopts = pcVar3->outoptsbuf;
        break;
      case 8:
        pcVar3->version = 1;
        break;
      case 9:
        iVar2 = atoi(_jas_optarg);
        pcVar3->debug = iVar2;
        break;
      case 10:
        iVar2 = atoi(_jas_optarg);
        pcVar3->cmptno = (long)iVar2;
        break;
      case 0xb:
        pcVar3->srgb = 1;
        break;
      case 0xc:
        uVar4 = strtoull(_jas_optarg,(char **)0x0,10);
        pcVar3->max_mem = uVar4;
        break;
      case 0xffffffff:
        pcVar5 = "warning: ignoring bogus command line argument %s\n";
        for (; _jas_optind < argc; _jas_optind = _jas_optind + 1) {
          fprintf(_stderr,"warning: ignoring bogus command line argument %s\n",argv[_jas_optind]);
        }
        if ((pcVar3->version != 0) || (-1 < pcVar3->outfmt)) {
          return pcVar3;
        }
        if (pcVar3->outfile != (char *)0x0) {
          iVar2 = jas_image_fmtfromname();
          pcVar3->outfmt = iVar2;
          if (-1 < iVar2) {
            return pcVar3;
          }
          fwrite("error: cannot guess image format from output file name\n",0x37,1,_stderr);
          if (-1 < pcVar3->outfmt) {
            return pcVar3;
          }
        }
        fwrite("error: no output format specified\n",0x22,1,_stderr);
        badusage();
LAB_001029ed:
        fprintf(_stderr,"error: invalid output format %s\n",pcVar5);
switchD_001027da_default:
        badusage();
        goto switchD_001027da_caseD_0;
      default:
        goto switchD_001027da_default;
      }
    } while( true );
  }
LAB_00102a12:
  fwrite("error: insufficient memory\n",0x1b,1,_stderr);
  exit(1);
switchD_001027da_caseD_0:
  cmdusage();
  goto LAB_00102a12;
}

Assistant:

cmdopts_t *cmdopts_parse(int argc, char **argv)
{
	enum {
		CMDOPT_HELP = 0,
		CMDOPT_VERBOSE,
		CMDOPT_INFILE,
		CMDOPT_INFMT,
		CMDOPT_INOPT,
		CMDOPT_OUTFILE,
		CMDOPT_OUTFMT,
		CMDOPT_OUTOPT,
		CMDOPT_VERSION,
		CMDOPT_DEBUG,
		CMDOPT_CMPTNO,
		CMDOPT_SRGB,
		CMDOPT_MAXMEM
	};

	static const jas_opt_t cmdoptions[] = {
		{CMDOPT_HELP, "help", 0},
		{CMDOPT_VERBOSE, "verbose", 0},
		{CMDOPT_INFILE, "input", JAS_OPT_HASARG},
		{CMDOPT_INFILE, "f", JAS_OPT_HASARG},
		{CMDOPT_INFMT, "input-format", JAS_OPT_HASARG},
		{CMDOPT_INFMT, "t", JAS_OPT_HASARG},
		{CMDOPT_INOPT, "input-option", JAS_OPT_HASARG},
		{CMDOPT_INOPT, "o", JAS_OPT_HASARG},
		{CMDOPT_OUTFILE, "output", JAS_OPT_HASARG},
		{CMDOPT_OUTFILE, "F", JAS_OPT_HASARG},
		{CMDOPT_OUTFMT, "output-format", JAS_OPT_HASARG},
		{CMDOPT_OUTFMT, "T", JAS_OPT_HASARG},
		{CMDOPT_OUTOPT, "output-option", JAS_OPT_HASARG},
		{CMDOPT_OUTOPT, "O", JAS_OPT_HASARG},
		{CMDOPT_VERSION, "version", 0},
		{CMDOPT_DEBUG, "debug-level", JAS_OPT_HASARG},
		{CMDOPT_CMPTNO, "cmptno", JAS_OPT_HASARG},
		{CMDOPT_SRGB, "force-srgb", 0},
		{CMDOPT_SRGB, "S", 0},
#if defined(JAS_DEFAULT_MAX_MEM_USAGE)
		{CMDOPT_MAXMEM, "memory-limit", JAS_OPT_HASARG},
#endif
		{-1, 0, 0}
	};

	cmdopts_t *cmdopts;
	int c;

	if (!(cmdopts = malloc(sizeof(cmdopts_t)))) {
		fprintf(stderr, "error: insufficient memory\n");
		exit(EXIT_FAILURE);
	}

	cmdopts->infile = 0;
	cmdopts->infmt = -1;
	cmdopts->inopts = 0;
	cmdopts->inoptsbuf[0] = '\0';
	cmdopts->outfile = 0;
	cmdopts->outfmt = -1;
	cmdopts->outopts = 0;
	cmdopts->outoptsbuf[0] = '\0';
	cmdopts->verbose = 0;
	cmdopts->version = 0;
	cmdopts->cmptno = -1;
	cmdopts->debug = 0;
	cmdopts->srgb = 0;
#if defined(JAS_DEFAULT_MAX_MEM_USAGE)
	cmdopts->max_mem = JAS_DEFAULT_MAX_MEM_USAGE;
#endif

	while ((c = jas_getopt(argc, argv, cmdoptions)) != EOF) {
		switch (c) {
		case CMDOPT_HELP:
			cmdusage();
			break;
		case CMDOPT_VERBOSE:
			cmdopts->verbose = 1;
			break;
		case CMDOPT_VERSION:
			cmdopts->version = 1;
			break;
		case CMDOPT_DEBUG:
			cmdopts->debug = atoi(jas_optarg);
			break;
		case CMDOPT_INFILE:
			cmdopts->infile = jas_optarg;
			break;
		case CMDOPT_INFMT:
			if ((cmdopts->infmt = jas_image_strtofmt(jas_optarg)) < 0) {
				fprintf(stderr, "warning: ignoring invalid input format %s\n",
				  jas_optarg);
				cmdopts->infmt = -1;
			}
			break;
		case CMDOPT_INOPT:
			addopt(cmdopts->inoptsbuf, OPTSMAX, jas_optarg);
			cmdopts->inopts = cmdopts->inoptsbuf;
			break;
		case CMDOPT_OUTFILE:
			cmdopts->outfile = jas_optarg;
			break;
		case CMDOPT_OUTFMT:
			if ((cmdopts->outfmt = jas_image_strtofmt(jas_optarg)) < 0) {
				fprintf(stderr, "error: invalid output format %s\n", jas_optarg);
				badusage();
			}
			break;
		case CMDOPT_OUTOPT:
			addopt(cmdopts->outoptsbuf, OPTSMAX, jas_optarg);
			cmdopts->outopts = cmdopts->outoptsbuf;
			break;
		case CMDOPT_CMPTNO:
			cmdopts->cmptno = atoi(jas_optarg);
			break;
		case CMDOPT_SRGB:
			cmdopts->srgb = 1;
			break;
		case CMDOPT_MAXMEM:
			cmdopts->max_mem = strtoull(jas_optarg, 0, 10);
			break;
		default:
			badusage();
			break;
		}
	}

	while (jas_optind < argc) {
		fprintf(stderr,
		  "warning: ignoring bogus command line argument %s\n",
		  argv[jas_optind]);
		++jas_optind;
	}

	if (cmdopts->version) {
		goto done;
	}

	if (cmdopts->outfmt < 0 && cmdopts->outfile) {
		if ((cmdopts->outfmt = jas_image_fmtfromname(cmdopts->outfile)) < 0) {
			fprintf(stderr,
			  "error: cannot guess image format from output file name\n");
		}
	}

	if (cmdopts->outfmt < 0) {
		fprintf(stderr, "error: no output format specified\n");
		badusage();
	}

done:
	return cmdopts;
}